

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_jmp_indirect_fetches_address_from_same_page_Test::TestBody
          (CpuTest_jmp_indirect_fetches_address_from_same_page_Test *this)

{
  undefined2 uVar1;
  undefined2 uVar2;
  bool bVar3;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  char *message;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_1c8;
  WithoutMatchers local_1a1;
  Matcher<unsigned_short> local_1a0;
  MockSpec<unsigned_char_(unsigned_short)> local_188;
  ReturnAction<int> local_168;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_jmp_indirect_fetches_address_from_same_page_Test *local_10;
  CpuTest_jmp_indirect_fetches_address_from_same_page_Test *this_local;
  
  (this->super_CpuTest).registers.pc = 0x1000;
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'l');
  (this->super_CpuTest).expected.pc = 0x6789;
  uVar1 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher(&local_48,uVar1 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_30,local_55,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x152,"mmu","read_byte(registers.pc + 1u)");
  testing::Return<int>((testing *)&local_88,0xff);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_78);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  uVar2 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher(&local_c0,uVar2 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_a8,&local_c1,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x153,"mmu","read_byte(registers.pc + 2u)");
  testing::Return<int>((testing *)&local_f8,0x12);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_e8);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
  testing::Matcher<unsigned_short>::~Matcher(&local_c0);
  testing::Matcher<unsigned_short>::Matcher(&local_130,0x12ff);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_118,&local_131,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x155,"mmu","read_byte(0x12FF)");
  testing::Return<int>((testing *)&local_168,0x89);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_158);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
  testing::Matcher<unsigned_short>::~Matcher(&local_130);
  testing::Matcher<unsigned_short>::Matcher(&local_1a0,0x1200);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_188,&(this->super_CpuTest).mmu.super_MockMmu,&local_1a0);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_188,&local_1a1,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x156,"mmu","read_byte(0x1200)");
  testing::Return<int>((testing *)&gtest_ar.message_,0x67);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_1c8,(ReturnAction *)&gtest_ar.message_);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_1c8);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1c8);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_188);
  testing::Matcher<unsigned_short>::~Matcher(&local_1a0);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x05');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_1e8,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(&local_1f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x15a,message);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  return;
}

Assistant:

TEST_F(CpuTest, jmp_indirect_fetches_address_from_same_page) {
    registers.pc = 0x1000;
    stage_instruction(JMP_IND);
    expected.pc = 0x6789;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));
    // Address is fetched from 0x12FF and 0x1200 instead of 0x12FF and 0x1300
    EXPECT_CALL(mmu, read_byte(0x12FF)).WillOnce(Return(0x89));
    EXPECT_CALL(mmu, read_byte(0x1200)).WillOnce(Return(0x67));

    step_execution(5);

    EXPECT_EQ(expected, registers);
}